

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_plain.c
# Opt level: O1

int saslplain_challenge(CONCRETE_SASL_MECHANISM_HANDLE concrete_sasl_mechanism,
                       SASL_MECHANISM_BYTES *challenge_bytes,SASL_MECHANISM_BYTES *response_bytes)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (concrete_sasl_mechanism == (CONCRETE_SASL_MECHANISM_HANDLE)0x0 ||
      response_bytes == (SASL_MECHANISM_BYTES *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0xcc;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_plain.c"
                ,"saslplain_challenge",0xcb,1,
                "Bad arguments: concrete_sasl_mechanism = %p, response_bytes = %p",
                concrete_sasl_mechanism,response_bytes);
    }
  }
  else {
    response_bytes->bytes = (void *)0x0;
    response_bytes->length = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int saslplain_challenge(CONCRETE_SASL_MECHANISM_HANDLE concrete_sasl_mechanism, const SASL_MECHANISM_BYTES* challenge_bytes, SASL_MECHANISM_BYTES* response_bytes)
{
    int result;

    (void)challenge_bytes;

    /* Codes_SRS_SASL_PLAIN_01_014: [If the `concrete_sasl_mechanism` or `response_bytes` argument is NULL then `saslplain_challenge` shall fail and return a non-zero value.] */
    if ((concrete_sasl_mechanism == NULL) ||
        (response_bytes == NULL))
    {
        LogError("Bad arguments: concrete_sasl_mechanism = %p, response_bytes = %p",
            concrete_sasl_mechanism, response_bytes);
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_SASL_PLAIN_01_012: [`saslplain_challenge` shall set the `response_bytes` buffer to NULL and 0 size as the PLAIN SASL mechanism does not implement challenge/response.] */
        response_bytes->bytes = NULL;
        response_bytes->length = 0;

        /* Codes_SRS_SASL_PLAIN_01_013: [On success, `saslplain_challenge` shall return 0.] */
        result = 0;
    }

    return result;
}